

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O0

uint64_t fiobj_obj2hash(FIOBJ o)

{
  size_t sVar1;
  undefined1 local_30 [8];
  fio_str_info_s s;
  FIOBJ o_local;
  
  s.data = (char *)o;
  sVar1 = fiobj_type_is(o,FIOBJ_T_STRING);
  if (sVar1 == 0) {
    if (((s.data == (char *)0x0) || (((ulong)s.data & 1) != 0)) || (((ulong)s.data & 6) == 6)) {
      o_local = (FIOBJ)s.data;
    }
    else {
      fiobj_obj2cstr((fio_str_info_s *)local_30,(FIOBJ)s.data);
      o_local = fio_siphash13((void *)s.len,s.capa,0x16f3e0,0x16f8b0);
    }
  }
  else {
    o_local = fiobj_str_hash((FIOBJ)s.data);
  }
  return o_local;
}

Assistant:

FIO_INLINE uint64_t fiobj_obj2hash(const FIOBJ o) {
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_STRING))
    return fiobj_str_hash(o);
  if (!FIOBJ_IS_ALLOCATED(o))
    return (uint64_t)o;
  fio_str_info_s s = fiobj_obj2cstr(o);
  return FIO_HASH_FN(s.data, s.len, &fiobj_each2, &fiobj_free_complex_object);
}